

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

QRegion __thiscall
QHeaderView::visualRegionForSelection(QHeaderView *this,QItemSelection *selection)

{
  QItemSelectionRange *pQVar1;
  QItemSelectionRange *pQVar2;
  QPersistentModelIndexData *pQVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long in_RDX;
  QModelIndex *__return_storage_ptr__;
  long lVar12;
  long lVar13;
  const_iterator __begin3;
  QItemSelectionRange *this_00;
  long in_FS_OFFSET;
  bool bVar14;
  const_iterator __end3;
  QModelIndex local_68;
  undefined1 local_50 [12];
  Representation local_44;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
  bVar14 = *(int *)&pQVar2[0x54].br.d == 1;
  pQVar3 = pQVar2[0x2f].br.d;
  __return_storage_ptr__ = &local_68;
  if (bVar14) {
    __return_storage_ptr__ = (QModelIndex *)local_50;
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,&pQVar2[0x3b].br);
  uVar4 = (**(code **)(*(long *)pQVar3 + 0x78 + (ulong)bVar14 * 8))(pQVar3,__return_storage_ptr__);
  this_00 = *(QItemSelectionRange **)(in_RDX + 8);
  lVar13 = *(long *)(in_RDX + 0x10);
  lVar12 = lVar13 * 0x10;
  pQVar1 = this_00 + lVar13;
  pQVar3 = pQVar2[0x56].br.d;
  if (*(int *)&pQVar2[0x54].br.d == 1) {
    if (pQVar3 == (QPersistentModelIndexData *)0x0) {
      uVar8 = uVar4;
      if (lVar13 == 0) {
        uVar9 = 0;
      }
      else {
        lVar13 = lVar13 << 4;
        uVar9 = 0;
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar14 = QItemSelectionRange::isValid(this_00), bVar14)) {
            iVar5 = QPersistentModelIndex::column();
            if (iVar5 < (int)uVar8) {
              uVar8 = QPersistentModelIndex::column();
            }
            iVar5 = QPersistentModelIndex::column();
            if ((int)uVar9 < iVar5) {
              uVar9 = QPersistentModelIndex::column();
            }
          }
          this_00 = this_00 + 1;
          lVar13 = lVar13 + -0x10;
        } while (lVar13 != 0);
      }
    }
    else {
      uVar9 = 0;
      if (lVar13 != 0) {
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar14 = QItemSelectionRange::isValid(this_00), bVar14)) {
            iVar5 = QPersistentModelIndex::column();
            iVar6 = QPersistentModelIndex::column();
            if (iVar5 <= iVar6) {
              do {
                uVar7 = visualIndex((QHeaderView *)selection,iVar5);
                uVar8 = uVar4;
                if ((int)uVar7 < (int)uVar4) {
                  uVar8 = uVar7;
                }
                uVar11 = uVar9;
                if ((int)uVar9 < (int)uVar7) {
                  uVar11 = uVar7;
                }
                if (uVar7 != 0xffffffff) {
                  uVar4 = uVar8;
                  uVar9 = uVar11;
                }
                iVar6 = QPersistentModelIndex::column();
                bVar14 = iVar5 < iVar6;
                iVar5 = iVar5 + 1;
              } while (bVar14);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pQVar1);
      }
      pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
      uVar8 = 0xffffffff;
      if (-1 < (int)uVar4) {
        if (*(int *)&pQVar2[0x65].tl.d == 0) {
          uVar8 = 0xffffffff;
          if ((int)uVar4 < *(int *)&pQVar2[0x65].br.d) {
            uVar8 = uVar4;
          }
        }
        else if (((int)uVar4 < *(int *)&pQVar2[100].br.d) &&
                (uVar8 = uVar4, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
          uVar8 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar4 * 4);
        }
      }
      if (*(int *)&pQVar2[0x65].tl.d == 0) {
        if (*(int *)&pQVar2[0x65].br.d <= (int)uVar9) {
          uVar9 = 0xffffffff;
        }
      }
      else if ((int)uVar9 < *(int *)&pQVar2[100].br.d) {
        if (pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0) {
          uVar9 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar9 * 4);
        }
      }
      else {
        uVar9 = 0xffffffff;
      }
    }
    if ((((-1 < (int)uVar8) && (iVar5 = count((QHeaderView *)selection), (int)uVar8 < iVar5)) &&
        (-1 < (int)uVar9)) && (iVar5 = count((QHeaderView *)selection), (int)uVar9 < iVar5)) {
      iVar5 = sectionViewportPosition((QHeaderView *)selection,uVar8);
      iVar6 = sectionViewportPosition((QHeaderView *)selection,uVar9);
      iVar10 = sectionSize((QHeaderView *)selection,uVar9);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_44.m_i = *(int *)&pQVar2[2].tl.d - *(int *)&pQVar2[1].br.d;
      local_50._4_4_ = 0;
      local_50._8_4_ = iVar10 + iVar6 + -1;
      local_50._0_4_ = iVar5;
LAB_005518e8:
      QRegion::QRegion((QRegion *)this,(QRect *)local_50,Rectangle);
      goto LAB_00551906;
    }
  }
  else {
    if (pQVar3 == (QPersistentModelIndexData *)0x0) {
      uVar8 = uVar4;
      if (lVar13 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar14 = QItemSelectionRange::isValid(this_00), bVar14)) {
            iVar5 = QPersistentModelIndex::row();
            if (iVar5 < (int)uVar8) {
              uVar8 = QPersistentModelIndex::row();
            }
            iVar5 = QPersistentModelIndex::row();
            if ((int)uVar4 < iVar5) {
              uVar4 = QPersistentModelIndex::row();
            }
          }
          this_00 = this_00 + 1;
          lVar12 = lVar12 + -0x10;
        } while (lVar12 != 0);
      }
    }
    else {
      uVar9 = 0;
      if (lVar13 != 0) {
        do {
          QPersistentModelIndex::parent();
          if (((((int)local_50._0_4_ < 0) || ((int)local_50._4_4_ < 0)) ||
              (local_40.ptr == (QAbstractItemModel *)0x0)) &&
             (bVar14 = QItemSelectionRange::isValid(this_00), bVar14)) {
            iVar5 = QPersistentModelIndex::row();
            iVar6 = QPersistentModelIndex::row();
            if (iVar5 <= iVar6) {
              do {
                uVar7 = visualIndex((QHeaderView *)selection,iVar5);
                uVar8 = uVar4;
                if ((int)uVar7 < (int)uVar4) {
                  uVar8 = uVar7;
                }
                uVar11 = uVar9;
                if ((int)uVar9 < (int)uVar7) {
                  uVar11 = uVar7;
                }
                if (uVar7 != 0xffffffff) {
                  uVar9 = uVar11;
                  uVar4 = uVar8;
                }
                iVar6 = QPersistentModelIndex::row();
                bVar14 = iVar5 < iVar6;
                iVar5 = iVar5 + 1;
              } while (bVar14);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pQVar1);
      }
      pQVar2 = (selection->super_QList<QItemSelectionRange>).d.ptr;
      uVar8 = 0xffffffff;
      if (-1 < (int)uVar4) {
        if (*(int *)&pQVar2[0x65].tl.d == 0) {
          uVar8 = 0xffffffff;
          if ((int)uVar4 < *(int *)&pQVar2[0x65].br.d) {
            uVar8 = uVar4;
          }
        }
        else if (((int)uVar4 < *(int *)&pQVar2[100].br.d) &&
                (uVar8 = uVar4, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
          uVar8 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar4 * 4);
        }
      }
      if (*(int *)&pQVar2[0x65].tl.d == 0) {
        uVar4 = 0xffffffff;
        if ((int)uVar9 < *(int *)&pQVar2[0x65].br.d) {
          uVar4 = uVar9;
        }
      }
      else {
        uVar4 = 0xffffffff;
        if (((int)uVar9 < *(int *)&pQVar2[100].br.d) &&
           (uVar4 = uVar9, pQVar2[0x58].tl.d != (QPersistentModelIndexData *)0x0)) {
          uVar4 = *(uint *)(pQVar2[0x57].br.d + (ulong)uVar9 * 4);
        }
      }
    }
    if ((((-1 < (int)uVar8) && (iVar5 = count((QHeaderView *)selection), (int)uVar8 < iVar5)) &&
        (-1 < (int)uVar4)) && (iVar5 = count((QHeaderView *)selection), (int)uVar4 < iVar5)) {
      iVar5 = sectionViewportPosition((QHeaderView *)selection,uVar8);
      iVar6 = sectionViewportPosition((QHeaderView *)selection,uVar4);
      iVar10 = sectionSize((QHeaderView *)selection,uVar4);
      pQVar2 = selection[1].super_QList<QItemSelectionRange>.d.ptr;
      local_50._8_4_ = *(int *)((long)&pQVar2[1].br.d + 4) - *(int *)((long)&pQVar2[1].tl.d + 4);
      local_50._0_4_ = 0;
      local_44.m_i = iVar10 + iVar6 + -1;
      local_50._4_4_ = iVar5;
      goto LAB_005518e8;
    }
  }
  QRegion::QRegion((QRegion *)this);
LAB_00551906:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QHeaderView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QHeaderView);
    const int max = d->modelSectionCount();

    if (d->orientation == Qt::Horizontal) {
        int logicalLeft = max;
        int logicalRight = 0;

        if (d->visualIndices.empty()) {
            // If no reordered sections, skip redundant visual-to-logical transformations
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                if (r.left() < logicalLeft)
                    logicalLeft = r.left();
                if (r.right() > logicalRight)
                    logicalRight = r.right();
            }
        } else {
            int left = max;
            int right = 0;
            for (const auto &r : selection) {
                if (r.parent().isValid() || !r.isValid())
                    continue; // we only know about toplevel items and we don't want invalid ranges
                for (int k = r.left(); k <= r.right(); ++k) {
                    int visual = visualIndex(k);
                    if (visual == -1)   // in some cases users may change the selections
                        continue;       // before we have a chance to do the layout
                    if (visual < left)
                        left = visual;
                    if (visual > right)
                        right = visual;
                }
            }
            logicalLeft = logicalIndex(left);
            logicalRight = logicalIndex(right);
        }

        if (logicalLeft < 0  || logicalLeft >= count() ||
            logicalRight < 0 || logicalRight >= count())
            return QRegion();

        int leftPos = sectionViewportPosition(logicalLeft);
        int rightPos = sectionViewportPosition(logicalRight);
        rightPos += sectionSize(logicalRight);
        return QRect(leftPos, 0, rightPos - leftPos, height());
    }
    // orientation() == Qt::Vertical
    int logicalTop = max;
    int logicalBottom = 0;

    if (d->visualIndices.empty()) {
        // If no reordered sections, skip redundant visual-to-logical transformations
        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            if (r.top() < logicalTop)
                logicalTop = r.top();
            if (r.bottom() > logicalBottom)
                logicalBottom = r.bottom();
        }
    } else {
        int top = max;
        int bottom = 0;

        for (const auto &r : selection) {
            if (r.parent().isValid() || !r.isValid())
                continue; // we only know about toplevel items and we don't want invalid ranges
            for (int k = r.top(); k <= r.bottom(); ++k) {
                int visual = visualIndex(k);
                if (visual == -1)   // in some cases users may change the selections
                    continue;       // before we have a chance to do the layout
                if (visual < top)
                    top = visual;
                if (visual > bottom)
                    bottom = visual;
            }
        }

        logicalTop = logicalIndex(top);
        logicalBottom = logicalIndex(bottom);
    }

    if (logicalTop < 0 || logicalTop >= count() ||
        logicalBottom < 0 || logicalBottom >= count())
        return QRegion();

    int topPos = sectionViewportPosition(logicalTop);
    int bottomPos = sectionViewportPosition(logicalBottom) + sectionSize(logicalBottom);

    return QRect(0, topPos, width(), bottomPos - topPos);
}